

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

void __thiscall caldate_t::set_julian_date(caldate_t *this,int jy,int jm,int jd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  div_t dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = div(jm + -1,0xc);
  iVar1 = dVar4.rem;
  iVar2 = iVar1 + 0xc;
  if (iVar1 != 0 && (long)dVar4 >= 0) {
    iVar2 = iVar1;
  }
  iVar3 = iVar2 + 0xd;
  if (1 < iVar2) {
    iVar3 = iVar2 + 1;
  }
  dVar5 = floor((double)(int)((((dVar4.quot + jy) - (uint)(iVar1 == 0 || (long)dVar4 < 0)) -
                              (uint)(iVar2 < 2)) + 0x126c) * 365.25);
  dVar6 = floor((double)(iVar3 + 1) * 30.6001);
  set_dayno(this,(int)((double)jd + dVar6 + dVar5 + -1524.5 + -1721119.5));
  return;
}

Assistant:

void set_julian_date(int jy, int jm, int jd)
    {
        /* adjust the month to 1-12 range */
        div_t mq = div(jm - 1, 12);
        if (mq.rem <= 0)
            mq.rem += 12, mq.quot -= 1;
        jm = mq.rem + 1;
        jy += mq.quot;
        

        /* 
         *   Calculate the Julian day number for the julian date, then
         *   subtract our Epoch's Julian day number to get our day number.
         */
        if (jm <= 2)
        {
            jy -= 1;
            jm += 12;
        }
        set_dayno((int32_t)(floor(365.25 * (jy + 4716))
                            + floor(30.6001 * (jm + 1))
                            + jd - 1524.5 - 1721119.5));
    }